

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::Reflection::SwapFields
          (Reflection *this,Message *message1,Message *message2,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *fields)

{
  FieldDescriptor *field;
  long lVar1;
  int iVar2;
  LogMessage *pLVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  iterator iVar4;
  Reflection *extraout_RDX;
  Reflection *extraout_RDX_00;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  int oneof_index;
  Message *local_70;
  set<int,_std::less<int>,_std::allocator<int>_> swapped_oneof;
  
  if (message1 != message2) {
    local_70 = message2;
    (*(message1->super_MessageLite)._vptr_MessageLite[0x15])(message1);
    if (extraout_RDX != this) {
      internal::LogMessage::LogMessage
                ((LogMessage *)&swapped_oneof,LOGLEVEL_FATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x2a7);
      pLVar3 = internal::LogMessage::operator<<
                         ((LogMessage *)&swapped_oneof,
                          "CHECK failed: (message1->GetReflection()) == (this): ");
      pLVar3 = internal::LogMessage::operator<<(pLVar3,"First argument to SwapFields() (of type \"")
      ;
      iVar2 = (*(message1->super_MessageLite)._vptr_MessageLite[0x15])(message1);
      pLVar3 = internal::LogMessage::operator<<
                         (pLVar3,*(string **)(CONCAT44(extraout_var,iVar2) + 8));
      pLVar3 = internal::LogMessage::operator<<
                         (pLVar3,
                          "\") is not compatible with this reflection object (which is for type \"")
      ;
      pLVar3 = internal::LogMessage::operator<<(pLVar3,*(string **)(this->descriptor_ + 8));
      pLVar3 = internal::LogMessage::operator<<
                         (pLVar3,
                          "\").  Note that the exact same class is required; not just the same descriptor."
                         );
      internal::LogFinisher::operator=((LogFinisher *)&oneof_index,pLVar3);
      internal::LogMessage::~LogMessage((LogMessage *)&swapped_oneof);
    }
    (*(local_70->super_MessageLite)._vptr_MessageLite[0x15])();
    if (extraout_RDX_00 != this) {
      internal::LogMessage::LogMessage
                ((LogMessage *)&swapped_oneof,LOGLEVEL_FATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x2af);
      pLVar3 = internal::LogMessage::operator<<
                         ((LogMessage *)&swapped_oneof,
                          "CHECK failed: (message2->GetReflection()) == (this): ");
      pLVar3 = internal::LogMessage::operator<<
                         (pLVar3,"Second argument to SwapFields() (of type \"");
      iVar2 = (*(local_70->super_MessageLite)._vptr_MessageLite[0x15])();
      pLVar3 = internal::LogMessage::operator<<
                         (pLVar3,*(string **)(CONCAT44(extraout_var_00,iVar2) + 8));
      pLVar3 = internal::LogMessage::operator<<
                         (pLVar3,
                          "\") is not compatible with this reflection object (which is for type \"")
      ;
      pLVar3 = internal::LogMessage::operator<<(pLVar3,*(string **)(this->descriptor_ + 8));
      pLVar3 = internal::LogMessage::operator<<
                         (pLVar3,
                          "\").  Note that the exact same class is required; not just the same descriptor."
                         );
      internal::LogFinisher::operator=((LogFinisher *)&oneof_index,pLVar3);
      internal::LogMessage::~LogMessage((LogMessage *)&swapped_oneof);
    }
    swapped_oneof._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &swapped_oneof._M_t._M_impl.super__Rb_tree_header._M_header;
    swapped_oneof._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    swapped_oneof._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    swapped_oneof._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    uVar5 = (ulong)((long)(fields->
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(fields->
                         super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                         )._M_impl.super__Vector_impl_data._M_start) >> 3;
    uVar7 = 0;
    uVar6 = uVar5 & 0xffffffff;
    swapped_oneof._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         swapped_oneof._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((int)uVar5 < 1) {
      uVar6 = uVar7;
    }
    for (; uVar6 != uVar7; uVar7 = uVar7 + 1) {
      field = (fields->
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              )._M_impl.super__Vector_impl_data._M_start[uVar7];
      if (field[0x42] == (FieldDescriptor)0x1) {
        uVar5 = (ulong)(uint)(this->schema_).extensions_offset_;
        internal::ExtensionSet::SwapExtension
                  ((ExtensionSet *)((long)&(message1->super_MessageLite)._vptr_MessageLite + uVar5),
                   (ExtensionSet *)((long)&(local_70->super_MessageLite)._vptr_MessageLite + uVar5),
                   *(int *)(field + 0x44));
      }
      else {
        lVar1 = *(long *)(field + 0x58);
        if (lVar1 == 0) {
          if (*(int *)(field + 0x3c) != 3) {
            SwapBit(this,message1,local_70,field);
          }
          SwapField(this,message1,local_70,field);
        }
        else {
          oneof_index = (int)((lVar1 - *(long *)(*(long *)(lVar1 + 0x10) + 0x30)) / 0x30);
          iVar4 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                  ::find(&swapped_oneof._M_t,&oneof_index);
          if ((_Rb_tree_header *)iVar4._M_node == &swapped_oneof._M_t._M_impl.super__Rb_tree_header)
          {
            std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            _M_insert_unique<int_const&>
                      ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                       &swapped_oneof,&oneof_index);
            SwapOneofField(this,message1,local_70,*(OneofDescriptor **)(field + 0x58));
          }
        }
      }
    }
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&swapped_oneof._M_t);
  }
  return;
}

Assistant:

void Reflection::SwapFields(
    Message* message1, Message* message2,
    const std::vector<const FieldDescriptor*>& fields) const {
  if (message1 == message2) return;

  // TODO(kenton):  Other Reflection methods should probably check this too.
  GOOGLE_CHECK_EQ(message1->GetReflection(), this)
      << "First argument to SwapFields() (of type \""
      << message1->GetDescriptor()->full_name()
      << "\") is not compatible with this reflection object (which is for type "
         "\""
      << descriptor_->full_name()
      << "\").  Note that the exact same class is required; not just the same "
         "descriptor.";
  GOOGLE_CHECK_EQ(message2->GetReflection(), this)
      << "Second argument to SwapFields() (of type \""
      << message2->GetDescriptor()->full_name()
      << "\") is not compatible with this reflection object (which is for type "
         "\""
      << descriptor_->full_name()
      << "\").  Note that the exact same class is required; not just the same "
         "descriptor.";

  std::set<int> swapped_oneof;

  const int fields_size = static_cast<int>(fields.size());
  for (int i = 0; i < fields_size; i++) {
    const FieldDescriptor* field = fields[i];
    if (field->is_extension()) {
      MutableExtensionSet(message1)->SwapExtension(
          MutableExtensionSet(message2), field->number());
    } else {
      if (field->containing_oneof()) {
        int oneof_index = field->containing_oneof()->index();
        // Only swap the oneof field once.
        if (swapped_oneof.find(oneof_index) != swapped_oneof.end()) {
          continue;
        }
        swapped_oneof.insert(oneof_index);
        SwapOneofField(message1, message2, field->containing_oneof());
      } else {
        // Swap has bit for non-repeated fields.  We have already checked for
        // oneof already.
        if (!field->is_repeated()) {
          SwapBit(message1, message2, field);
        }
        // Swap field.
        SwapField(message1, message2, field);
      }
    }
  }
}